

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyDB_PageHandle.cc
# Opt level: O3

void * __thiscall MyDB_PageHandleBase::getBytes(MyDB_PageHandleBase *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  MyDB_BufferManager *pMVar1;
  MyDB_LRU *pMVar2;
  element_type *peVar3;
  MyDB_PageBase *pMVar4;
  void *pvVar5;
  void *addr;
  MyDB_PageBase *pMVar6;
  MyDB_TablePtr local_70;
  pair<std::shared_ptr<MyDB_Table>,_long> local_60;
  pair<std::shared_ptr<MyDB_Table>,_long> local_48;
  pair<std::shared_ptr<MyDB_Table>,_long> local_30;
  
  pMVar4 = this->pagePtr;
  this_00 = (pMVar4->pageId).first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      pMVar4 = this->pagePtr;
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  pMVar1 = this->bufferManager;
  if (pMVar4->addr == (void *)0x0) {
    pMVar2 = pMVar1->LRU;
    peVar3 = (pMVar4->pageId).first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if ((pMVar1->availPageQueue).c.super__Deque_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        (pMVar1->availPageQueue).c.super__Deque_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
      local_48.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (pMVar4->pageId).first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      pMVar6 = pMVar4;
      if (local_48.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_48.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_48.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
          pMVar6 = this->pagePtr;
        }
        else {
          (local_48.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_48.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_48.second = (pMVar4->pageId).second;
      local_48.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
      pvVar5 = MyDB_LRU::evictAndReplace(pMVar2,&local_48,pMVar6);
      if (local_48.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    else {
      local_60.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (pMVar4->pageId).first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      pMVar6 = pMVar4;
      if (local_60.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_60.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_60.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
          pMVar6 = this->pagePtr;
        }
        else {
          (local_60.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_60.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_60.second = (pMVar4->pageId).second;
      local_60.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
      MyDB_LRU::add(pMVar2,&local_60,pMVar6);
      if (local_60.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      pvVar5 = *(this->bufferManager->availPageQueue).c.
                super__Deque_base<void_*,_std::allocator<void_*>_>._M_impl.super__Deque_impl_data.
                _M_start._M_cur;
      std::deque<void_*,_std::allocator<void_*>_>::pop_front
                (&(this->bufferManager->availPageQueue).c);
    }
    pMVar4 = this->pagePtr;
    pMVar4->addr = pvVar5;
    local_70.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pMVar4->pageId).first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_70.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (pMVar4->pageId).first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    addr = pvVar5;
    pMVar6 = pMVar4;
    if (local_70.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_70.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_70.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
        pMVar6 = this->pagePtr;
        addr = pMVar6->addr;
      }
      else {
        (local_70.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_70.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    MyDB_PageBase::readFromDisk(pMVar4,&local_70,(pMVar6->pageId).second,addr);
    if (local_70.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  else {
    pMVar2 = pMVar1->LRU;
    local_30.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pMVar4->pageId).first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_30.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (pMVar4->pageId).first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_30.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_30.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count =
             (local_30.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_30.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count =
             (local_30.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    local_30.second = (pMVar4->pageId).second;
    MyDB_LRU::adjust(pMVar2,&local_30);
    if (local_30.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    pvVar5 = this->pagePtr->addr;
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return pvVar5;
}

Assistant:

void *MyDB_PageHandleBase :: getBytes () {
	//store the spare address in the buffer that we will return
	void* spareAddr;
	pair<MyDB_TablePtr, long> curId = this->pagePtr->pageId;

	//map<pair<MyDB_TablePtr, long>, MyDB_Page>::iterator it_pageMap = this->bufferManager->pageMap.find(curId);
	//If find this page in buffer
	if (this->pagePtr->addr != nullptr) {
		this -> bufferManager -> LRU -> adjust(this -> pagePtr -> pageId);
		spareAddr = this->pagePtr->addr;

	}

	//If this page is in the disk and we need to read from disk and put it in the buffer
	else {
		//If there is no empty space in the buffer
		if (this->bufferManager->availPageQueue.empty()) {
			spareAddr = this -> bufferManager -> LRU -> evictAndReplace(this -> pagePtr -> pageId, this -> pagePtr);
		}
		else {
			this -> bufferManager -> LRU -> add(this -> pagePtr -> pageId, this -> pagePtr);
			spareAddr = this -> bufferManager -> availPageQueue.front();
			this -> bufferManager -> availPageQueue.pop();
		}
		this -> pagePtr -> addr = spareAddr;
		this -> pagePtr -> readFromDisk(this -> pagePtr -> pageId.first, this -> pagePtr -> pageId.second, this -> pagePtr ->addr);
	}

	return spareAddr;
}